

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

int class_metadata_methods_impl_cb_iterate(map m,map_key key,map_value val,map_cb_iterate_args args)

{
  long lVar1;
  value *ppvVar2;
  value pvVar3;
  long in_RCX;
  method_conflict in_RDI;
  value *v_array;
  class_metadata_iterator_args iterator;
  
  ppvVar2 = value_to_array((value)0x10af4f);
  pvVar3 = method_metadata(in_RDI);
  lVar1 = *(long *)(in_RCX + 8);
  *(long *)(in_RCX + 8) = lVar1 + 1;
  ppvVar2[lVar1] = pvVar3;
  return 0;
}

Assistant:

int class_metadata_methods_impl_cb_iterate(map m, map_key key, map_value val, map_cb_iterate_args args)
{
	class_metadata_iterator_args iterator = (class_metadata_iterator_args)args;
	value *v_array = value_to_array(iterator->v);

	(void)m;
	(void)key;

	v_array[iterator->count++] = method_metadata((method)val);

	return 0;
}